

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_demonfire(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = is_opp_align(ch,(CHAR_DATA *)vo);
  iVar2 = dice(level,bVar1 | 4);
  if ((CHAR_DATA *)vo != ch) {
    act("$n calls forth the demons of Hell upon $N!",ch,(void *)0x0,vo,1);
    act("$n assails you with the demons of Hell!",ch,(void *)0x0,vo,2);
    send_to_char("You conjure forth the demons of hell!\n\r",ch);
  }
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,9);
  iVar3 = iVar2 / 2;
  if (!bVar1) {
    iVar3 = iVar2;
  }
  iVar2 = 9;
  damage_old(ch,(CHAR_DATA *)vo,iVar3,sn,9,true);
  if (*(short *)((long)vo + 0x2dc) == 0) {
    iVar3 = number_percent();
    if (0x4b < iVar3) {
      bVar1 = is_affected_by((CHAR_DATA *)vo,10);
      if (!bVar1) {
        iVar3 = level * 3 + 3;
        if (-1 < level * 3) {
          iVar3 = level * 3;
        }
        spell_curse((int)gsn_curse,iVar3 >> 2,ch,vo,iVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void spell_demonfire(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam, dam_mod, oldhp;

	oldhp = victim->hit;

	if (is_opp_align(ch, victim))
		dam_mod = (int)5.5;
	else
		dam_mod = 4;

	dam = dice(level, dam_mod);

	if (victim != ch)
	{
		act("$n calls forth the demons of Hell upon $N!", ch, nullptr, victim, TO_NOTVICT);
		act("$n assails you with the demons of Hell!", ch, nullptr, victim, TO_VICT);
		send_to_char("You conjure forth the demons of hell!\n\r", ch);
	}

	if (saves_spell(level, victim, DAM_NEGATIVE))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_NEGATIVE, true);

	if (victim->ghost)
		return;

	if (number_percent() > 75 && !is_affected_by(victim, AFF_CURSE))
		spell_curse(gsn_curse, 3 * level / 4, ch, (void *)victim, TARGET_CHAR);
}